

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cc
# Opt level: O2

void setPreferredVelocities
               (RVOSimulator *sim,vector<RVO::Vector3,_std::allocator<RVO::Vector3>_> *goals)

{
  pointer pVVar1;
  long lVar2;
  Vector3 *pVVar3;
  float fVar4;
  Vector3 goalVector;
  Vector3 local_48 [12];
  Vector3 local_3c [12];
  
  lVar2 = 0;
  for (pVVar3 = (Vector3 *)0x0;
      pVVar3 < (Vector3 *)(*(long *)(sim + 0x20) - *(long *)(sim + 0x18) >> 3); pVVar3 = pVVar3 + 1)
  {
    pVVar1 = (goals->super__Vector_base<RVO::Vector3,_std::allocator<RVO::Vector3>_>)._M_impl.
             super__Vector_impl_data._M_start;
    RVO::RVOSimulator::getAgentPosition((ulong)sim);
    RVO::Vector3::operator-(local_3c,pVVar1 + lVar2);
    fVar4 = (float)RVO::absSq(local_3c);
    if (1.0 < fVar4) {
      RVO::normalize(local_48);
      RVO::Vector3::operator=(local_3c,local_48);
      RVO::Vector3::~Vector3(local_48);
    }
    RVO::RVOSimulator::setAgentPrefVelocity((ulong)sim,pVVar3);
    RVO::Vector3::~Vector3(local_3c);
    lVar2 = lVar2 + 0xc;
  }
  return;
}

Assistant:

void setPreferredVelocities(RVO::RVOSimulator *sim,
                            const std::vector<RVO::Vector3> &goals) {
  /* Set the preferred velocity to be a vector of unit magnitude (speed) in the
   * direction of the goal.
   */
  for (std::size_t i = 0U; i < sim->getNumAgents(); ++i) {
    RVO::Vector3 goalVector = goals[i] - sim->getAgentPosition(i);

    if (RVO::absSq(goalVector) > 1.0F) {
      goalVector = RVO::normalize(goalVector);
    }

    sim->setAgentPrefVelocity(i, goalVector);
  }
}